

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O2

void __thiscall
miniros::Publication::removeSubscriberLink(Publication *this,SubscriberLinkPtr *sub_link)

{
  mutex *__mutex;
  int iVar1;
  __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
  __position;
  SubscriberLinkPtr link;
  __shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __mutex = &this->subscriber_links_mutex_;
  std::mutex::lock(__mutex);
  if (this->dropped_ == false) {
    iVar1 = (*((sub_link->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_SubscriberLink[6])();
    if ((char)iVar1 != '\0') {
      this->intraprocess_subscriber_count_ = this->intraprocess_subscriber_count_ - 1;
    }
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<miniros::SubscriberLink>*,std::vector<std::shared_ptr<miniros::SubscriberLink>,std::allocator<std::shared_ptr<miniros::SubscriberLink>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<miniros::SubscriberLink>const>>
                           ((this->subscriber_links_).
                            super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->subscriber_links_).
                            super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,sub_link);
    if (__position._M_current !=
        (this->subscriber_links_).
        super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_38,
                 &(__position._M_current)->
                  super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>);
      std::
      vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
      ::erase(&this->subscriber_links_,(const_iterator)__position._M_current);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (local_38._M_ptr != (element_type *)0x0) {
      peerDisconnect(this,(SubscriberLinkPtr *)&local_38);
    }
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void Publication::removeSubscriberLink(const SubscriberLinkPtr& sub_link)
{
  SubscriberLinkPtr link;
  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

    if (dropped_)
    {
      return;
    }

    if (sub_link->isIntraprocess())
    {
      --intraprocess_subscriber_count_;
    }

    V_SubscriberLink::iterator it = std::find(subscriber_links_.begin(), subscriber_links_.end(), sub_link);
    if (it != subscriber_links_.end())
    {
      link = *it;
      subscriber_links_.erase(it);
    }
  }

  if (link)
  {
    peerDisconnect(link);
  }
}